

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

int chacha_test_multiblock_incremental(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t srclen;
  uint8_t *out_00;
  ulong uVar5;
  uint8_t *in_00;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long local_118;
  chacha_state local_f8;
  uint8_t final [64];
  
  uVar2 = 1;
  local_118 = -1;
  for (uVar8 = 1; uVar8 < 0x800; uVar8 = uVar8 + 0x3d) {
    memset(out,0,0x800);
    local_f8.opaque._0_8_ = *(undefined8 *)key->b;
    local_f8.opaque._8_8_ = *(undefined8 *)(key->b + 8);
    local_f8.opaque._16_8_ = *(undefined8 *)(key->b + 0x10);
    local_f8.opaque._24_8_ = *(undefined8 *)(key->b + 0x18);
    local_f8.opaque[0x20] = 0xff;
    local_f8.opaque[0x21] = 0xff;
    local_f8.opaque[0x22] = 0xff;
    local_f8.opaque[0x23] = 0xff;
    local_f8.opaque[0x24] = '\0';
    local_f8.opaque[0x25] = '\0';
    local_f8.opaque[0x26] = '\0';
    local_f8.opaque[0x27] = '\0';
    local_f8.opaque._40_8_ = *(undefined8 *)iv->b;
    local_f8.opaque[0x30] = '\b';
    local_f8.opaque[0x31] = '\0';
    local_f8.opaque[0x32] = '\0';
    local_f8.opaque[0x33] = '\0';
    local_f8.opaque[0x34] = '\0';
    local_f8.opaque[0x35] = '\0';
    local_f8.opaque[0x36] = '\0';
    local_f8.opaque[0x37] = '\0';
    local_f8.opaque[0x38] = '\0';
    local_f8.opaque[0x39] = '\0';
    local_f8.opaque[0x3a] = '\0';
    local_f8.opaque[0x3b] = '\0';
    local_f8.opaque[0x3c] = '\0';
    local_f8.opaque[0x3d] = '\0';
    local_f8.opaque[0x3e] = '\0';
    local_f8.opaque[0x3f] = '\0';
    lVar7 = 0;
    uVar5 = 0;
    out_00 = out;
    uVar6 = uVar8;
    while( true ) {
      uVar4 = 0x800;
      if (uVar6 < 0x800) {
        uVar4 = uVar6;
      }
      if (0x800 < uVar5) break;
      in_00 = in + uVar5;
      if (in == (uint8_t *)0x0) {
        in_00 = (uint8_t *)0x0;
      }
      uVar5 = uVar5 + uVar8;
      sVar3 = chacha_update(&local_f8,in_00,out_00,uVar4 + lVar7);
      out_00 = out_00 + sVar3;
      uVar6 = uVar6 + uVar8;
      lVar7 = lVar7 + local_118;
    }
    chacha_final(&local_f8,out_00);
    chacha_test_compact_array(final,out,srclen);
    iVar1 = bcmp(expected_chacha,final,0x40);
    uVar2 = uVar2 & iVar1 == 0;
    local_118 = local_118 + -0x3d;
  }
  return uVar2;
}

Assistant:

static int
chacha_test_multiblock_incremental(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    size_t i, inc;
    uint8_t *p;
    int res = 1;

    for (inc = 1; inc < CHACHA_TEST_LEN; inc += 61) {
        p = out;
        memset(out, 0, CHACHA_TEST_LEN);
        chacha_test_init_state(&st, key, iv);
        for(i = 0; i <= CHACHA_TEST_LEN; i += inc)
            p += chacha_update(&st, (in) ? (in + i) : NULL, p, ((i + inc) > CHACHA_TEST_LEN) ? (CHACHA_TEST_LEN - i) : inc);
        chacha_final(&st, p);
        chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
        res &= (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
    }

    return res;
}